

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

void phys_page_compact(uc_struct_conflict15 *uc,PhysPageEntry *lp,Node *nodes)

{
  uint uVar1;
  uint local_34;
  int i;
  PhysPageEntry *p;
  int valid;
  uint valid_ptr;
  Node *nodes_local;
  PhysPageEntry *lp_local;
  uc_struct_conflict15 *uc_local;
  
  p._4_4_ = 0x200;
  p._0_4_ = 0;
  if ((uint)*lp >> 6 != 0x3ffffff) {
    uVar1 = (uint)*lp >> 6;
    for (local_34 = 0; (int)local_34 < 0x200; local_34 = local_34 + 1) {
      if ((uint)nodes[uVar1][(int)local_34] >> 6 != 0x3ffffff) {
        p._4_4_ = local_34;
        p._0_4_ = (int)p + 1;
        if (((uint)nodes[uVar1][(int)local_34] & 0x3f) != 0) {
          phys_page_compact(uc,nodes[uVar1] + (int)local_34,nodes);
        }
      }
    }
    if ((int)p == 1) {
      if (0x1ff < p._4_4_) {
        __assert_fail("valid_ptr < P_L2_SIZE",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/exec.c"
                      ,0xd7,"void phys_page_compact(struct uc_struct *, PhysPageEntry *, Node *)");
      }
      *lp = (PhysPageEntry)((uint)*lp & 0x3f | (uint)nodes[uVar1][p._4_4_] & 0xffffffc0);
      if (((uint)nodes[uVar1][p._4_4_] & 0x3f) == 0) {
        *lp = (PhysPageEntry)((uint)*lp & 0xffffffc0);
      }
      else {
        *lp = (PhysPageEntry)
              ((uint)*lp & 0xffffffc0 |
              ((uint)*lp & 0x3f) + ((uint)nodes[uVar1][p._4_4_] & 0x3f) & 0x3f);
      }
    }
  }
  return;
}

Assistant:

static void phys_page_compact(struct uc_struct *uc, PhysPageEntry *lp, Node *nodes)
{
    unsigned valid_ptr = P_L2_SIZE;
    int valid = 0;
    PhysPageEntry *p;
    int i;

    if (lp->ptr == PHYS_MAP_NODE_NIL) {
        return;
    }

    p = nodes[lp->ptr];
    for (i = 0; i < P_L2_SIZE; i++) {
        if (p[i].ptr == PHYS_MAP_NODE_NIL) {
            continue;
        }

        valid_ptr = i;
        valid++;
        if (p[i].skip) {
            phys_page_compact(uc, &p[i], nodes);
        }
    }

    /* We can only compress if there's only one child. */
    if (valid != 1) {
        return;
    }

    assert(valid_ptr < P_L2_SIZE);

    /* Don't compress if it won't fit in the # of bits we have. */
    if (P_L2_LEVELS >= (1 << 6) &&
        lp->skip + p[valid_ptr].skip >= (1 << 6)) {
        return;
    }

    lp->ptr = p[valid_ptr].ptr;
    if (!p[valid_ptr].skip) {
        /* If our only child is a leaf, make this a leaf. */
        /* By design, we should have made this node a leaf to begin with so we
         * should never reach here.
         * But since it's so simple to handle this, let's do it just in case we
         * change this rule.
         */
        lp->skip = 0;
    } else {
        lp->skip += p[valid_ptr].skip;
    }
}